

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
embree::ImageT<embree::Col3<float>_>::ImageT
          (ImageT<embree::Col3<float>_> *this,size_t width,size_t height,Col3<float> *color,
          string *name)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  Col3<float> *pCVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_Image).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Image_002c5c10;
  (this->super_Image).width = width;
  (this->super_Image).height = height;
  (this->super_Image).name._M_dataplus._M_p = (pointer)&(this->super_Image).name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Image).name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002c7238;
  uVar6 = height * width;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar6;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar5 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  pCVar3 = (Col3<float> *)operator_new__(uVar5);
  this->data = pCVar3;
  if (uVar6 != 0) {
    lVar4 = 8;
    do {
      pCVar3 = this->data;
      *(float *)((long)pCVar3 + lVar4 + -8) = color->r;
      *(float *)((long)pCVar3 + lVar4 + -4) = color->g;
      *(float *)((long)&pCVar3->r + lVar4) = color->b;
      lVar4 = lVar4 + 0xc;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, const T& color, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      for (size_t i=0; i<width*height; i++) data[i] = color;
    }